

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  byte u;
  pointer pcVar1;
  element_type *peVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  size_t pos;
  string_t result;
  
  throw_if_invalid_utf8(s);
  sVar4 = extra_space(s,ensure_ascii);
  if (sVar4 == 0) {
    peVar2 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar2->_vptr_output_adapter_protocol[1])(peVar2,(s->_M_dataplus)._M_p,s->_M_string_length);
    return;
  }
  result._M_dataplus._M_p = (pointer)&result.field_2;
  std::__cxx11::string::_M_construct((ulong)&result,(char)sVar4 + (char)s->_M_string_length);
  pos = 0;
  uVar6 = 0;
  do {
    if (s->_M_string_length <= uVar6) {
      if (pos != result._M_string_length) {
        __assert_fail("pos == result.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                      ,0x19dd,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      peVar2 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar2->_vptr_output_adapter_protocol[1])(peVar2,result._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&result);
      return;
    }
    u = (s->_M_dataplus)._M_p[uVar6];
    switch(u) {
    case 8:
      result._M_dataplus._M_p[pos + 1] = 'b';
      break;
    case 9:
      result._M_dataplus._M_p[pos + 1] = 't';
      break;
    case 10:
      result._M_dataplus._M_p[pos + 1] = 'n';
      break;
    case 0xb:
switchD_0010db40_caseD_b:
      if ((char)u < '\0') {
        if (ensure_ascii) goto LAB_0010db95;
LAB_0010dc3f:
        result._M_dataplus._M_p[pos] = u;
        pos = pos + 1;
      }
      else {
        if ((u != 0x7f || !ensure_ascii) && 0x1f < u) goto LAB_0010dc3f;
LAB_0010db95:
        sVar4 = bytes_following(u);
        if (sVar4 == 0xffffffffffffffff) {
          __assert_fail("bytes != std::string::npos",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                        ,0x19a1,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        if (s->_M_string_length <= sVar4 + uVar6) {
          __assert_fail("i + bytes < s.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                        ,0x19a4,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        if (3 < sVar4) {
          __assert_fail("bytes <= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                        ,0x19ab,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        pcVar1 = (s->_M_dataplus)._M_p;
        uVar5 = (uint)(byte)pcVar1[uVar6];
        switch(sVar4) {
        case 0:
          goto switchD_0010dbcb_caseD_0;
        case 1:
          uVar5 = ((byte)pcVar1[uVar6] & 0x3f) << 6;
          uVar3 = (byte)pcVar1[uVar6 + 1] & 0x7f;
          break;
        case 2:
          uVar3 = ((byte)pcVar1[uVar6 + 1] & 0x7f) * 0x40 + (uVar5 & 0x1f) * 0x1000;
          uVar5 = (byte)pcVar1[uVar6 + 2] & 0x7f;
          break;
        case 3:
          uVar3 = ((byte)pcVar1[uVar6 + 1] & 0x7f) * 0x1000 + (uVar5 & 0xf) * 0x40000;
          uVar5 = ((byte)pcVar1[uVar6 + 3] & 0x7f) + ((byte)pcVar1[uVar6 + 2] & 0x7f) * 0x40;
        }
        uVar5 = uVar5 + uVar3;
switchD_0010dbcb_caseD_0:
        escape_codepoint(uVar5,&result,&pos);
        uVar6 = sVar4 + uVar6;
      }
      goto LAB_0010dc2b;
    case 0xc:
      result._M_dataplus._M_p[pos + 1] = 'f';
      break;
    case 0xd:
      result._M_dataplus._M_p[pos + 1] = 'r';
      break;
    default:
      if (u != 0x5c) {
        if (u != 0x22) goto switchD_0010db40_caseD_b;
        result._M_dataplus._M_p[pos + 1] = '\"';
      }
    }
    pos = pos + 2;
LAB_0010dc2b:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii) const
    {
        throw_if_invalid_utf8(s);

        const auto space = extra_space(s, ensure_ascii);
        if (space == 0)
        {
            o->write_characters(s.c_str(), s.size());
            return;
        }

        // create a result string of necessary size
        string_t result(s.size() + space, '\\');
        std::size_t pos = 0;

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            switch (s[i])
            {
                case '"': // quotation mark (0x22)
                {
                    result[pos + 1] = '"';
                    pos += 2;
                    break;
                }

                case '\\': // reverse solidus (0x5C)
                {
                    // nothing to change
                    pos += 2;
                    break;
                }

                case '\b': // backspace (0x08)
                {
                    result[pos + 1] = 'b';
                    pos += 2;
                    break;
                }

                case '\f': // formfeed (0x0C)
                {
                    result[pos + 1] = 'f';
                    pos += 2;
                    break;
                }

                case '\n': // newline (0x0A)
                {
                    result[pos + 1] = 'n';
                    pos += 2;
                    break;
                }

                case '\r': // carriage return (0x0D)
                {
                    result[pos + 1] = 'r';
                    pos += 2;
                    break;
                }

                case '\t': // horizontal tab (0x09)
                {
                    result[pos + 1] = 't';
                    pos += 2;
                    break;
                }

                default:
                {
                    // escape control characters (0x00..0x1F) or, if
                    // ensure_ascii parameter is used, non-ASCII characters
                    if ((0x00 <= s[i] and s[i] <= 0x1F) or
                            (ensure_ascii and (s[i] & 0x80 or s[i] == 0x7F)))
                    {
                        const auto bytes = bytes_following(static_cast<uint8_t>(s[i]));
                        // invalid characters will be detected by throw_if_invalid_utf8
                        assert (bytes != std::string::npos);

                        // check that the additional bytes are present
                        assert(i + bytes < s.size());

                        // to use \uxxxx escaping, we first need to calculate
                        // the codepoint from the UTF-8 bytes
                        int codepoint = 0;

                        // bytes is unsigned type:
                        assert(bytes <= 3);
                        switch (bytes)
                        {
                            case 0:
                            {
                                codepoint = s[i] & 0xFF;
                                break;
                            }

                            case 1:
                            {
                                codepoint = ((s[i] & 0x3F) << 6)
                                            + (s[i + 1] & 0x7F);
                                break;
                            }

                            case 2:
                            {
                                codepoint = ((s[i] & 0x1F) << 12)
                                            + ((s[i + 1] & 0x7F) << 6)
                                            + (s[i + 2] & 0x7F);
                                break;
                            }

                            case 3:
                            {
                                codepoint = ((s[i] & 0xF) << 18)
                                            + ((s[i + 1] & 0x7F) << 12)
                                            + ((s[i + 2] & 0x7F) << 6)
                                            + (s[i + 3] & 0x7F);
                                break;
                            }

                            default:
                                break;  // LCOV_EXCL_LINE
                        }

                        escape_codepoint(codepoint, result, pos);
                        i += bytes;
                    }
                    else
                    {
                        // all other characters are added as-is
                        result[pos++] = s[i];
                    }
                    break;
                }
            }
        }

        assert(pos == result.size());
        o->write_characters(result.c_str(), result.size());
    }